

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::UnaryOperatorWrapper,duckdb::CastTimestampUsToSec>
               (timestamp_t *ldata,timestamp_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  ulong uVar2;
  timestamp_t tVar3;
  ulong uVar4;
  idx_t i;
  idx_t iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      tVar3 = CastTimestampUsToSec::Operation<duckdb::timestamp_t,duckdb::timestamp_t>
                        (ldata[iVar5].value);
      result_data[iVar5].value = tVar3.value;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    uVar8 = 0;
    for (uVar6 = 0; uVar6 != count + 0x3f >> 6; uVar6 = uVar6 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar9 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar9 = count;
        }
LAB_0075ca93:
        for (; uVar4 = uVar8, uVar8 < uVar9; uVar8 = uVar8 + 1) {
          tVar3 = CastTimestampUsToSec::Operation<duckdb::timestamp_t,duckdb::timestamp_t>
                            (ldata[uVar8].value);
          result_data[uVar8].value = tVar3.value;
        }
      }
      else {
        uVar2 = puVar1[uVar6];
        uVar9 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar9 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_0075ca93;
        uVar4 = uVar9;
        if (uVar2 != 0) {
          for (uVar7 = 0; uVar4 = uVar8 + uVar7, uVar8 + uVar7 < uVar9; uVar7 = uVar7 + 1) {
            if ((uVar2 >> (uVar7 & 0x3f) & 1) != 0) {
              tVar3 = CastTimestampUsToSec::Operation<duckdb::timestamp_t,duckdb::timestamp_t>
                                (ldata[uVar8 + uVar7].value);
              result_data[uVar8 + uVar7].value = tVar3.value;
            }
          }
        }
      }
      uVar8 = uVar4;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}